

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O0

string * __thiscall
spvtools::opt::Function::PrettyPrint_abi_cxx11_
          (string *__return_storage_ptr__,Function *this,uint32_t options)

{
  anon_class_16_2_6495e9f6 local_1c8;
  function<void_(const_spvtools::opt::Instruction_*)> local_1b8;
  ostringstream local_198 [8];
  ostringstream str;
  uint32_t options_local;
  Function *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  local_1c8.str = (ostringstream *)local_198;
  local_1c8.options = options;
  std::function<void(spvtools::opt::Instruction_const*)>::
  function<spvtools::opt::Function::PrettyPrint[abi:cxx11](unsigned_int)const::__0,void>
            ((function<void(spvtools::opt::Instruction_const*)> *)&local_1b8,&local_1c8);
  ForEachInst(this,&local_1b8,false,false);
  std::function<void_(const_spvtools::opt::Instruction_*)>::~function(&local_1b8);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string Function::PrettyPrint(uint32_t options) const {
  std::ostringstream str;
  ForEachInst([&str, options](const Instruction* inst) {
    str << inst->PrettyPrint(options);
    if (inst->opcode() != spv::Op::OpFunctionEnd) {
      str << std::endl;
    }
  });
  return str.str();
}